

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O1

void secp256k1_fe_normalize(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (r->n[4] >> 0x30) * 0x1000003d1 + r->n[0];
  uVar3 = (uVar1 >> 0x34) + r->n[1];
  uVar1 = uVar1 & 0xfffffffffffff;
  uVar4 = (uVar3 >> 0x34) + r->n[2];
  uVar2 = (uVar4 >> 0x34) + r->n[3];
  uVar4 = uVar4 & 0xfffffffffffff;
  uVar5 = (uVar2 >> 0x34) + (r->n[4] & 0xffffffffffff);
  uVar1 = ((ulong)(0xffffefffffc2e < uVar1 &&
                  ((uVar4 & uVar3 & uVar2) == 0xfffffffffffff && uVar5 == 0xffffffffffff)) |
          uVar5 >> 0x30) * 0x1000003d1 + uVar1;
  uVar3 = (uVar1 >> 0x34) + (uVar3 & 0xfffffffffffff);
  uVar4 = (uVar3 >> 0x34) + uVar4;
  uVar2 = (uVar4 >> 0x34) + (uVar2 & 0xfffffffffffff);
  r->n[0] = uVar1 & 0xfffffffffffff;
  r->n[1] = uVar3 & 0xfffffffffffff;
  r->n[2] = uVar4 & 0xfffffffffffff;
  r->n[3] = uVar2 & 0xfffffffffffff;
  r->n[4] = (uVar2 >> 0x34) + uVar5 & 0xffffffffffff;
  return;
}

Assistant:

static void secp256k1_fe_normalize(secp256k1_fe *r) {
    uint64_t t0 = r->n[0], t1 = r->n[1], t2 = r->n[2], t3 = r->n[3], t4 = r->n[4];

    /* Reduce t4 at the start so there will be at most a single carry from the first pass */
    uint64_t m;
    uint64_t x = t4 >> 48; t4 &= 0x0FFFFFFFFFFFFULL;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x1000003D1ULL;
    t1 += (t0 >> 52); t0 &= 0xFFFFFFFFFFFFFULL;
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL; m = t1;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL; m &= t2;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL; m &= t3;

    /* ... except for a possible carry at bit 48 of t4 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t4 >> 49 == 0);

    /* At most a single final reduction is needed; check if the value is >= the field characteristic */
    x = (t4 >> 48) | ((t4 == 0x0FFFFFFFFFFFFULL) & (m == 0xFFFFFFFFFFFFFULL)
        & (t0 >= 0xFFFFEFFFFFC2FULL));

    /* Apply the final reduction (for constant-time behaviour, we do it always) */
    t0 += x * 0x1000003D1ULL;
    t1 += (t0 >> 52); t0 &= 0xFFFFFFFFFFFFFULL;
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL;

    /* If t4 didn't carry to bit 48 already, then it should have after any final reduction */
    VERIFY_CHECK(t4 >> 48 == x);

    /* Mask off the possible multiple of 2^256 from the final reduction */
    t4 &= 0x0FFFFFFFFFFFFULL;

    r->n[0] = t0; r->n[1] = t1; r->n[2] = t2; r->n[3] = t3; r->n[4] = t4;

#ifdef VERIFY
    r->magnitude = 1;
    r->normalized = 1;
    secp256k1_fe_verify(r);
#endif
}